

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * __thiscall QPDF::getEncryptionKey_abi_cxx11_(string *__return_storage_ptr__,QPDF *this)

{
  pointer pMVar1;
  element_type *peVar2;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar2 = std::
           __shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar1->encp);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar2->encryption_key);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDF::getEncryptionKey() const
{
    return m->encp->encryption_key;
}